

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<51UL> * __thiscall
mserialize::cx_strcat<42ul,7ul,1ul,1ul>
          (cx_string<51UL> *__return_storage_ptr__,mserialize *this,cx_string<42UL> *strings,
          cx_string<7UL> *strings_1,cx_string<1UL> *strings_2,cx_string<1UL> *strings_3)

{
  long lVar1;
  ulong uVar2;
  char **ppcVar3;
  ulong local_98 [3];
  size_t size [5];
  char *data [5];
  
  ppcVar3 = data + 3;
  data[3] = (char *)0x0;
  data[4] = (char *)0x0;
  size[4] = (size_t)this;
  data[0] = strings_1->_data;
  data[1] = strings_2->_data;
  local_98[1] = 0x2a;
  local_98[2] = 7;
  lVar1 = 1;
  size[0] = 1;
  size[1] = 1;
  do {
    if (local_98[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)ppcVar3 + uVar2) = *(undefined1 *)(size[lVar1 + 3] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_98[lVar1]);
      ppcVar3 = (char **)((long)ppcVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  __return_storage_ptr__->_data[0x33] = '\0';
  *(char **)__return_storage_ptr__->_data = data[3];
  *(char **)(__return_storage_ptr__->_data + 8) = data[4];
  __return_storage_ptr__->_data[0x10] = '\0';
  __return_storage_ptr__->_data[0x11] = '\0';
  __return_storage_ptr__->_data[0x12] = '\0';
  __return_storage_ptr__->_data[0x13] = '\0';
  __return_storage_ptr__->_data[0x14] = '\0';
  __return_storage_ptr__->_data[0x15] = '\0';
  __return_storage_ptr__->_data[0x16] = '\0';
  __return_storage_ptr__->_data[0x17] = '\0';
  __return_storage_ptr__->_data[0x18] = '\0';
  __return_storage_ptr__->_data[0x19] = '\0';
  __return_storage_ptr__->_data[0x1a] = '\0';
  __return_storage_ptr__->_data[0x1b] = '\0';
  __return_storage_ptr__->_data[0x1c] = '\0';
  __return_storage_ptr__->_data[0x1d] = '\0';
  __return_storage_ptr__->_data[0x1e] = '\0';
  __return_storage_ptr__->_data[0x1f] = '\0';
  __return_storage_ptr__->_data[0x20] = '\0';
  __return_storage_ptr__->_data[0x21] = '\0';
  __return_storage_ptr__->_data[0x22] = '\0';
  __return_storage_ptr__->_data[0x23] = '\0';
  __return_storage_ptr__->_data[0x24] = '\0';
  __return_storage_ptr__->_data[0x25] = '\0';
  __return_storage_ptr__->_data[0x26] = '\0';
  __return_storage_ptr__->_data[0x27] = '\0';
  __return_storage_ptr__->_data[0x28] = '\0';
  __return_storage_ptr__->_data[0x29] = '\0';
  __return_storage_ptr__->_data[0x2a] = '\0';
  __return_storage_ptr__->_data[0x2b] = '\0';
  __return_storage_ptr__->_data[0x2c] = '\0';
  __return_storage_ptr__->_data[0x2d] = '\0';
  __return_storage_ptr__->_data[0x2e] = '\0';
  __return_storage_ptr__->_data[0x2f] = '\0';
  __return_storage_ptr__->_data[0x2f] = '\0';
  __return_storage_ptr__->_data[0x30] = '\0';
  __return_storage_ptr__->_data[0x31] = '\0';
  __return_storage_ptr__->_data[0x32] = '\0';
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}